

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_ToInt32Free(JSContext *ctx,int32_t *pres,JSValue val)

{
  int iVar1;
  JSValueUnion JVar2;
  JSToNumberHintEnum flag;
  uint uVar3;
  int iVar4;
  int iVar6;
  JSValue val_00;
  JSValue JVar7;
  int64_t iVar5;
  
  iVar5 = val.tag;
  JVar7.tag = (int64_t)val.u.ptr;
  JVar7.u.float64 = val.u.float64;
  do {
    JVar2 = JVar7.u;
    flag = (JSToNumberHintEnum)iVar5;
    if (flag < 4) {
LAB_00122fc1:
      iVar4 = 0;
      iVar1 = JVar2.int32;
      goto LAB_00122fc3;
    }
    if (flag == 7) {
      uVar3 = JVar7.u._4_4_ >> 0x14 & 0x7ff;
      if (uVar3 < 0x41e) {
        JVar2._0_4_ = (uint)JVar2.float64;
        JVar2._4_4_ = 0;
        goto LAB_00122fc1;
      }
      iVar4 = 0;
      if (0x452 < uVar3) goto LAB_00122f9f;
      iVar6 = (int)((((ulong)JVar2.ptr & 0xfffffffffffff) + 0x10000000000000 <<
                    ((char)uVar3 - 0x13U & 0x3f)) >> 0x20);
      iVar1 = -iVar6;
      if (-1 < (long)JVar2.ptr) {
        iVar1 = iVar6;
      }
      goto LAB_00122fc3;
    }
    val_00.tag = iVar5;
    val_00.u.float64 = JVar2.float64;
    JVar7 = JS_ToNumberHintFree(ctx,val_00,flag);
    iVar5 = JVar7.tag;
  } while ((int)JVar7.tag != 6);
  iVar4 = -1;
LAB_00122f9f:
  iVar1 = 0;
LAB_00122fc3:
  *pres = iVar1;
  return iVar4;
}

Assistant:

static int JS_ToInt32Free(JSContext *ctx, int32_t *pres, JSValue val)
{
    uint32_t tag;
    int32_t ret;

 redo:
    tag = JS_VALUE_GET_NORM_TAG(val);
    switch(tag) {
    case JS_TAG_INT:
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
    case JS_TAG_UNDEFINED:
        ret = JS_VALUE_GET_INT(val);
        break;
    case JS_TAG_FLOAT64:
        {
            JSFloat64Union u;
            double d;
            int e;
            d = JS_VALUE_GET_FLOAT64(val);
            u.d = d;
            /* we avoid doing fmod(x, 2^32) */
            e = (u.u64 >> 52) & 0x7ff;
            if (likely(e <= (1023 + 30))) {
                /* fast case */
                ret = (int32_t)d;
            } else if (e <= (1023 + 30 + 53)) {
                uint64_t v;
                /* remainder modulo 2^32 */
                v = (u.u64 & (((uint64_t)1 << 52) - 1)) | ((uint64_t)1 << 52);
                v = v << ((e - 1023) - 52 + 32);
                ret = v >> 32;
                /* take the sign into account */
                if (u.u64 >> 63)
                    ret = -ret;
            } else {
                ret = 0; /* also handles NaN and +inf */
            }
        }
        break;
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_FLOAT:
        {
            JSBigFloat *p = JS_VALUE_GET_PTR(val);
            bf_get_int32(&ret, &p->num, BF_GET_INT_MOD);
            JS_FreeValue(ctx, val);
        }
        break;
#endif
    default:
        val = JS_ToNumberFree(ctx, val);
        if (JS_IsException(val)) {
            *pres = 0;
            return -1;
        }
        goto redo;
    }
    *pres = ret;
    return 0;
}